

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *this,char *permut,uint *param_3)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint *puVar8;
  CImgArgumentException *this_00;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  char *in_RDX;
  CImg<unsigned_int> *in_RSI;
  CImg<unsigned_int> *in_RDI;
  int x_22;
  int y_22;
  int z_22;
  int c_22;
  unsigned_long whd_22;
  unsigned_long wh_22;
  int x_21;
  int y_21;
  int z_21;
  int c_21;
  unsigned_long whd_21;
  unsigned_long wh_21;
  int x_20;
  int y_20;
  int z_20;
  int c_20;
  unsigned_long whd_20;
  unsigned_long wh_20;
  int x_19;
  int y_19;
  int z_19;
  int c_19;
  unsigned_long whd_19;
  unsigned_long wh_19;
  int x_18;
  int y_18;
  int z_18;
  int c_18;
  unsigned_long whd_18;
  unsigned_long wh_18;
  int x_17;
  int y_17;
  int z_17;
  int c_17;
  unsigned_long whd_17;
  unsigned_long wh_17;
  uint siz_7;
  uint *ptrd_3;
  uint *ptr_a_1;
  uint *ptr_b_3;
  uint *ptr_g_5;
  uint *ptr_r_7;
  uint siz_6;
  uint *ptrd_2;
  uint *ptr_b_2;
  uint *ptr_g_4;
  uint *ptr_r_6;
  uint siz_5;
  uint *ptrd_1;
  uint *ptr_g_3;
  uint *ptr_r_5;
  uint siz_4;
  uint *ptrd;
  uint *ptr_r_4;
  int x_16;
  int y_16;
  int z_16;
  int c_16;
  unsigned_long whd_16;
  unsigned_long wh_16;
  int x_15;
  int y_15;
  int z_15;
  int c_15;
  unsigned_long whd_15;
  unsigned_long wh_15;
  int x_14;
  int y_14;
  int z_14;
  int c_14;
  unsigned_long whd_14;
  unsigned_long wh_14;
  int x_13;
  int y_13;
  int z_13;
  int c_13;
  unsigned_long whd_13;
  unsigned_long wh_13;
  int x_12;
  int y_12;
  int z_12;
  int c_12;
  unsigned_long whd_12;
  unsigned_long wh_12;
  int x_11;
  int y_11;
  int z_11;
  int c_11;
  unsigned_long whd_11;
  unsigned_long wh_11;
  int x_10;
  int y_10;
  int z_10;
  int c_10;
  unsigned_long whd_10;
  unsigned_long wh_10;
  int x_9;
  int y_9;
  int z_9;
  int c_9;
  unsigned_long whd_9;
  unsigned_long wh_9;
  int x_8;
  int y_8;
  int z_8;
  int c_8;
  unsigned_long whd_8;
  unsigned_long wh_8;
  uint siz_3;
  uint *ptr_a;
  uint *ptr_b_1;
  uint *ptr_g_2;
  uint *ptr_r_3;
  uint siz_2;
  uint *ptr_b;
  uint *ptr_g_1;
  uint *ptr_r_2;
  uint siz_1;
  uint *ptr_g;
  uint *ptr_r_1;
  uint siz;
  uint *ptr_r;
  int x_7;
  int y_7;
  int z_7;
  int c_7;
  unsigned_long whd_7;
  unsigned_long wh_7;
  int x_6;
  int y_6;
  int z_6;
  int c_6;
  unsigned_long whd_6;
  unsigned_long wh_6;
  int x_5;
  int y_5;
  int z_5;
  int c_5;
  unsigned_long whd_5;
  unsigned_long wh_5;
  int x_4;
  int y_4;
  int z_4;
  int c_4;
  unsigned_long whd_4;
  unsigned_long wh_4;
  int x_3;
  int y_3;
  int z_3;
  int c_3;
  unsigned_long whd_3;
  unsigned_long wh_3;
  int x_2;
  int y_2;
  int z_2;
  int c_2;
  unsigned_long whd_2;
  unsigned_long wh_2;
  int x_1;
  int y_1;
  int z_1;
  int c_1;
  unsigned_long whd_1;
  unsigned_long wh_1;
  int x;
  int y;
  int z;
  int c;
  unsigned_long whd;
  unsigned_long wh;
  uint *ptrs;
  CImg<unsigned_int> res;
  CImg<unsigned_int> *in_stack_fffffffffffff978;
  CImg<unsigned_int> *in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffffa08;
  undefined1 is_shared;
  undefined4 in_stack_fffffffffffffa10;
  uint in_stack_fffffffffffffa14;
  CImg<unsigned_int> *in_stack_fffffffffffffa18;
  uint *in_stack_fffffffffffffa50;
  uint *in_stack_fffffffffffffa58;
  CImg<unsigned_int> *in_stack_fffffffffffffa60;
  uint uVar13;
  uint local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_420;
  uint local_41c;
  uint local_418;
  uint local_414;
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3a0;
  uint local_39c;
  uint local_398;
  uint local_394;
  int local_37c;
  uint *local_378;
  uint *local_370;
  uint *local_368;
  uint *local_360;
  uint *local_358;
  int local_34c;
  uint *local_348;
  uint *local_340;
  uint *local_338;
  CImg<unsigned_int> *local_330;
  int local_324;
  uint *local_320;
  uint *local_318;
  uint *local_310;
  int local_304;
  uint *local_300;
  uint *local_2f8;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  uint local_2c4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  uint local_290;
  uint local_28c;
  uint local_288;
  uint local_284;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  uint local_250;
  uint local_24c;
  uint local_248;
  uint local_244;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  int local_1cc;
  uint *local_1c8;
  uint *local_1c0;
  uint *local_1b8;
  uint *local_1b0;
  int local_1a4;
  uint *local_1a0;
  uint *local_198;
  uint *local_190;
  int local_184;
  uint *local_180;
  uint *local_178;
  int local_16c;
  uint *local_168;
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint *local_50;
  CImg<unsigned_int> local_48;
  char *local_20;
  
  is_shared = (undefined1)((ulong)in_stack_fffffffffffffa08 >> 0x38);
  local_20 = in_RDX;
  bVar4 = is_empty(in_RSI);
  if ((bVar4) || (local_20 == (char *)0x0)) {
    CImg(in_stack_fffffffffffffa18,
         (CImg<unsigned_int> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
         (bool)is_shared);
    return in_RDI;
  }
  CImg(&local_48);
  local_50 = in_RSI->_data;
  iVar5 = cimg::strncasecmp(local_20,"xyzc",4);
  if (iVar5 == 0) {
    operator+(in_stack_fffffffffffff978);
  }
  else {
    iVar5 = cimg::strncasecmp(local_20,"xycz",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_74 = 0; (int)local_74 < (int)in_RSI->_spectrum; local_74 = local_74 + 1) {
        for (local_78 = 0; (int)local_78 < (int)in_RSI->_depth; local_78 = local_78 + 1) {
          for (local_7c = 0; (int)local_7c < (int)in_RSI->_height; local_7c = local_7c + 1) {
            for (local_80 = 0; (int)local_80 < (int)in_RSI->_width; local_80 = local_80 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_80,local_7c,local_74,local_78,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"xzyc",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_94 = 0; (int)local_94 < (int)in_RSI->_spectrum; local_94 = local_94 + 1) {
        for (local_98 = 0; (int)local_98 < (int)in_RSI->_depth; local_98 = local_98 + 1) {
          for (local_9c = 0; (int)local_9c < (int)in_RSI->_height; local_9c = local_9c + 1) {
            for (local_a0 = 0; (int)local_a0 < (int)in_RSI->_width; local_a0 = local_a0 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_a0,local_98,local_9c,local_94,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"xzcy",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_b4 = 0; (int)local_b4 < (int)in_RSI->_spectrum; local_b4 = local_b4 + 1) {
        for (local_b8 = 0; (int)local_b8 < (int)in_RSI->_depth; local_b8 = local_b8 + 1) {
          for (local_bc = 0; (int)local_bc < (int)in_RSI->_height; local_bc = local_bc + 1) {
            for (local_c0 = 0; (int)local_c0 < (int)in_RSI->_width; local_c0 = local_c0 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_c0,local_b8,local_b4,local_bc,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"xcyz",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_d4 = 0; (int)local_d4 < (int)in_RSI->_spectrum; local_d4 = local_d4 + 1) {
        for (local_d8 = 0; (int)local_d8 < (int)in_RSI->_depth; local_d8 = local_d8 + 1) {
          for (local_dc = 0; (int)local_dc < (int)in_RSI->_height; local_dc = local_dc + 1) {
            for (local_e0 = 0; (int)local_e0 < (int)in_RSI->_width; local_e0 = local_e0 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_e0,local_d4,local_dc,local_d8,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"xczy",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_f4 = 0; (int)local_f4 < (int)in_RSI->_spectrum; local_f4 = local_f4 + 1) {
        for (local_f8 = 0; (int)local_f8 < (int)in_RSI->_depth; local_f8 = local_f8 + 1) {
          for (local_fc = 0; (int)local_fc < (int)in_RSI->_height; local_fc = local_fc + 1) {
            for (local_100 = 0; (int)local_100 < (int)in_RSI->_width; local_100 = local_100 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_100,local_f4,local_f8,local_fc,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"yxzc",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_114 = 0; (int)local_114 < (int)in_RSI->_spectrum; local_114 = local_114 + 1) {
        for (local_118 = 0; (int)local_118 < (int)in_RSI->_depth; local_118 = local_118 + 1) {
          for (local_11c = 0; (int)local_11c < (int)in_RSI->_height; local_11c = local_11c + 1) {
            for (local_120 = 0; (int)local_120 < (int)in_RSI->_width; local_120 = local_120 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_11c,local_120,local_118,local_114,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"yxcz",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_134 = 0; (int)local_134 < (int)in_RSI->_spectrum; local_134 = local_134 + 1) {
        for (local_138 = 0; (int)local_138 < (int)in_RSI->_depth; local_138 = local_138 + 1) {
          for (local_13c = 0; (int)local_13c < (int)in_RSI->_height; local_13c = local_13c + 1) {
            for (local_140 = 0; (int)local_140 < (int)in_RSI->_width; local_140 = local_140 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_13c,local_140,local_134,local_138,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"yzxc",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_154 = 0; (int)local_154 < (int)in_RSI->_spectrum; local_154 = local_154 + 1) {
        for (local_158 = 0; (int)local_158 < (int)in_RSI->_depth; local_158 = local_158 + 1) {
          for (local_15c = 0; (int)local_15c < (int)in_RSI->_height; local_15c = local_15c + 1) {
            for (local_160 = 0; (int)local_160 < (int)in_RSI->_width; local_160 = local_160 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_15c,local_158,local_160,local_154,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"yzcx",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      switch(in_RSI->_width) {
      case 1:
        local_168 = data(&local_48,0,0,0,0);
        for (local_16c = in_RSI->_height * in_RSI->_depth * in_RSI->_spectrum; local_16c != 0;
            local_16c = local_16c + -1) {
          *local_168 = *local_50;
          local_168 = local_168 + 1;
          local_50 = local_50 + 1;
        }
        break;
      case 2:
        local_178 = data(&local_48,0,0,0,0);
        local_180 = data(&local_48,0,0,0,1);
        for (local_184 = in_RSI->_height * in_RSI->_depth * in_RSI->_spectrum; local_184 != 0;
            local_184 = local_184 + -1) {
          puVar8 = local_50 + 1;
          *local_178 = *local_50;
          local_50 = local_50 + 2;
          *local_180 = *puVar8;
          local_180 = local_180 + 1;
          local_178 = local_178 + 1;
        }
        break;
      case 3:
        local_190 = data(&local_48,0,0,0,0);
        local_198 = data(&local_48,0,0,0,1);
        local_1a0 = data(&local_48,0,0,0,2);
        for (local_1a4 = in_RSI->_height * in_RSI->_depth * in_RSI->_spectrum; local_1a4 != 0;
            local_1a4 = local_1a4 + -1) {
          *local_190 = *local_50;
          puVar8 = local_50 + 2;
          *local_198 = local_50[1];
          local_50 = local_50 + 3;
          *local_1a0 = *puVar8;
          local_1a0 = local_1a0 + 1;
          local_198 = local_198 + 1;
          local_190 = local_190 + 1;
        }
        break;
      case 4:
        local_1b0 = data(&local_48,0,0,0,0);
        local_1b8 = data(&local_48,0,0,0,1);
        local_1c0 = data(&local_48,0,0,0,2);
        local_1c8 = data(&local_48,0,0,0,3);
        for (local_1cc = in_RSI->_height * in_RSI->_depth * in_RSI->_spectrum; local_1cc != 0;
            local_1cc = local_1cc + -1) {
          *local_1b0 = *local_50;
          *local_1b8 = local_50[1];
          puVar8 = local_50 + 3;
          *local_1c0 = local_50[2];
          local_50 = local_50 + 4;
          *local_1c8 = *puVar8;
          local_1c8 = local_1c8 + 1;
          local_1c0 = local_1c0 + 1;
          local_1b8 = local_1b8 + 1;
          local_1b0 = local_1b0 + 1;
        }
        break;
      default:
        for (local_1e4 = 0; (int)local_1e4 < (int)in_RSI->_spectrum; local_1e4 = local_1e4 + 1) {
          for (local_1e8 = 0; (int)local_1e8 < (int)in_RSI->_depth; local_1e8 = local_1e8 + 1) {
            for (local_1ec = 0; (int)local_1ec < (int)in_RSI->_height; local_1ec = local_1ec + 1) {
              for (local_1f0 = 0; (int)local_1f0 < (int)in_RSI->_width; local_1f0 = local_1f0 + 1) {
                uVar13 = *local_50;
                puVar8 = operator()(&local_48,local_1ec,local_1e8,local_1e4,local_1f0,
                                    (ulong)local_48._width * (ulong)local_48._height,
                                    (ulong)local_48._width * (ulong)local_48._height *
                                    (ulong)local_48._depth);
                *puVar8 = uVar13;
                local_50 = local_50 + 1;
              }
            }
          }
        }
        CImg(in_stack_fffffffffffffa18,
             (CImg<unsigned_int> *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        goto LAB_0016d13c;
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"ycxz",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_204 = 0; (int)local_204 < (int)in_RSI->_spectrum; local_204 = local_204 + 1) {
        for (local_208 = 0; (int)local_208 < (int)in_RSI->_depth; local_208 = local_208 + 1) {
          for (local_20c = 0; (int)local_20c < (int)in_RSI->_height; local_20c = local_20c + 1) {
            for (local_210 = 0; (int)local_210 < (int)in_RSI->_width; local_210 = local_210 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_20c,local_204,local_210,local_208,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"yczx",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_224 = 0; (int)local_224 < (int)in_RSI->_spectrum; local_224 = local_224 + 1) {
        for (local_228 = 0; (int)local_228 < (int)in_RSI->_depth; local_228 = local_228 + 1) {
          for (local_22c = 0; (int)local_22c < (int)in_RSI->_height; local_22c = local_22c + 1) {
            for (local_230 = 0; (int)local_230 < (int)in_RSI->_width; local_230 = local_230 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_22c,local_224,local_228,local_230,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"zxyc",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_244 = 0; (int)local_244 < (int)in_RSI->_spectrum; local_244 = local_244 + 1) {
        for (local_248 = 0; (int)local_248 < (int)in_RSI->_depth; local_248 = local_248 + 1) {
          for (local_24c = 0; (int)local_24c < (int)in_RSI->_height; local_24c = local_24c + 1) {
            for (local_250 = 0; (int)local_250 < (int)in_RSI->_width; local_250 = local_250 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_248,local_250,local_24c,local_244,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"zxcy",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_264 = 0; (int)local_264 < (int)in_RSI->_spectrum; local_264 = local_264 + 1) {
        for (local_268 = 0; (int)local_268 < (int)in_RSI->_depth; local_268 = local_268 + 1) {
          for (local_26c = 0; (int)local_26c < (int)in_RSI->_height; local_26c = local_26c + 1) {
            for (local_270 = 0; (int)local_270 < (int)in_RSI->_width; local_270 = local_270 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_268,local_270,local_264,local_26c,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"zyxc",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_284 = 0; (int)local_284 < (int)in_RSI->_spectrum; local_284 = local_284 + 1) {
        for (local_288 = 0; (int)local_288 < (int)in_RSI->_depth; local_288 = local_288 + 1) {
          for (local_28c = 0; (int)local_28c < (int)in_RSI->_height; local_28c = local_28c + 1) {
            for (local_290 = 0; (int)local_290 < (int)in_RSI->_width; local_290 = local_290 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_288,local_28c,local_290,local_284,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"zycx",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_2a4 = 0; (int)local_2a4 < (int)in_RSI->_spectrum; local_2a4 = local_2a4 + 1) {
        for (local_2a8 = 0; (int)local_2a8 < (int)in_RSI->_depth; local_2a8 = local_2a8 + 1) {
          for (local_2ac = 0; (int)local_2ac < (int)in_RSI->_height; local_2ac = local_2ac + 1) {
            for (local_2b0 = 0; (int)local_2b0 < (int)in_RSI->_width; local_2b0 = local_2b0 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_2a8,local_2ac,local_2a4,local_2b0,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"zcxy",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_2c4 = 0; (int)local_2c4 < (int)in_RSI->_spectrum; local_2c4 = local_2c4 + 1) {
        for (local_2c8 = 0; (int)local_2c8 < (int)in_RSI->_depth; local_2c8 = local_2c8 + 1) {
          for (local_2cc = 0; (int)local_2cc < (int)in_RSI->_height; local_2cc = local_2cc + 1) {
            for (local_2d0 = 0; (int)local_2d0 < (int)in_RSI->_width; local_2d0 = local_2d0 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_2c8,local_2c4,local_2d0,local_2cc,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"zcyx",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_2e4 = 0; (int)local_2e4 < (int)in_RSI->_spectrum; local_2e4 = local_2e4 + 1) {
        for (local_2e8 = 0; (int)local_2e8 < (int)in_RSI->_depth; local_2e8 = local_2e8 + 1) {
          for (local_2ec = 0; (int)local_2ec < (int)in_RSI->_height; local_2ec = local_2ec + 1) {
            for (local_2f0 = 0; (int)local_2f0 < (int)in_RSI->_width; local_2f0 = local_2f0 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_2e8,local_2e4,local_2ec,local_2f0,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"cxyz",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      switch(in_RSI->_spectrum) {
      case 1:
        local_2f8 = data(in_RSI,0,0,0,0);
        local_300 = local_48._data;
        for (local_304 = in_RSI->_width * in_RSI->_height * in_RSI->_depth; local_304 != 0;
            local_304 = local_304 + -1) {
          *local_300 = *local_2f8;
          local_300 = local_300 + 1;
          local_2f8 = local_2f8 + 1;
        }
        break;
      case 2:
        local_310 = data(in_RSI,0,0,0,0);
        local_318 = data(in_RSI,0,0,0,1);
        local_320 = local_48._data;
        for (local_324 = in_RSI->_width * in_RSI->_height * in_RSI->_depth; local_324 != 0;
            local_324 = local_324 + -1) {
          puVar8 = local_320 + 1;
          *local_320 = *local_310;
          local_320 = local_320 + 2;
          *puVar8 = *local_318;
          local_318 = local_318 + 1;
          local_310 = local_310 + 1;
        }
        break;
      case 3:
        local_330 = (CImg<unsigned_int> *)data(in_RSI,0,0,0,0);
        in_stack_fffffffffffffa60 = local_330;
        local_338 = data(in_RSI,0,0,0,1);
        in_stack_fffffffffffffa58 = local_338;
        in_stack_fffffffffffffa50 = data(in_RSI,0,0,0,2);
        local_348 = local_48._data;
        local_340 = in_stack_fffffffffffffa50;
        for (local_34c = in_RSI->_width * in_RSI->_height * in_RSI->_depth; local_34c != 0;
            local_34c = local_34c + -1) {
          *local_348 = local_330->_width;
          puVar8 = local_348 + 2;
          local_348[1] = *local_338;
          local_348 = local_348 + 3;
          *puVar8 = *local_340;
          local_340 = local_340 + 1;
          local_338 = local_338 + 1;
          local_330 = (CImg<unsigned_int> *)&local_330->_height;
        }
        break;
      case 4:
        local_358 = data(in_RSI,0,0,0,0);
        local_360 = data(in_RSI,0,0,0,1);
        local_368 = data(in_RSI,0,0,0,2);
        local_370 = data(in_RSI,0,0,0,3);
        local_378 = local_48._data;
        for (local_37c = in_RSI->_width * in_RSI->_height * in_RSI->_depth; local_37c != 0;
            local_37c = local_37c + -1) {
          *local_378 = *local_358;
          local_378[1] = *local_360;
          puVar8 = local_378 + 3;
          local_378[2] = *local_368;
          local_378 = local_378 + 4;
          *puVar8 = *local_370;
          local_370 = local_370 + 1;
          local_368 = local_368 + 1;
          local_360 = local_360 + 1;
          local_358 = local_358 + 1;
        }
        break;
      default:
        uVar7 = (ulong)local_48._width;
        uVar11 = (ulong)local_48._height;
        uVar12 = (ulong)local_48._depth;
        for (local_394 = 0; (int)local_394 < (int)in_RSI->_spectrum; local_394 = local_394 + 1) {
          for (local_398 = 0; (int)local_398 < (int)in_RSI->_depth; local_398 = local_398 + 1) {
            for (local_39c = 0; (int)local_39c < (int)in_RSI->_height; local_39c = local_39c + 1) {
              for (local_3a0 = 0; (int)local_3a0 < (int)in_RSI->_width; local_3a0 = local_3a0 + 1) {
                uVar13 = *local_50;
                puVar8 = operator()(&local_48,local_394,local_3a0,local_39c,local_398,uVar7 * uVar11
                                    ,uVar7 * uVar11 * uVar12);
                *puVar8 = uVar13;
                local_50 = local_50 + 1;
              }
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"cxzy",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_3b4 = 0; (int)local_3b4 < (int)in_RSI->_spectrum; local_3b4 = local_3b4 + 1) {
        for (local_3b8 = 0; (int)local_3b8 < (int)in_RSI->_depth; local_3b8 = local_3b8 + 1) {
          for (local_3bc = 0; (int)local_3bc < (int)in_RSI->_height; local_3bc = local_3bc + 1) {
            for (local_3c0 = 0; (int)local_3c0 < (int)in_RSI->_width; local_3c0 = local_3c0 + 1) {
              in_stack_fffffffffffffa14 = *local_50;
              in_stack_fffffffffffffa18 =
                   (CImg<unsigned_int> *)
                   operator()(&local_48,local_3b4,local_3c0,local_3b8,local_3bc,uVar7 * uVar11,
                              uVar7 * uVar11 * uVar12);
              in_stack_fffffffffffffa18->_width = in_stack_fffffffffffffa14;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar5 = cimg::strncasecmp(local_20,"cyxz",4);
    if (iVar5 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_3d4 = 0; (int)local_3d4 < (int)in_RSI->_spectrum; local_3d4 = local_3d4 + 1) {
        for (local_3d8 = 0; (int)local_3d8 < (int)in_RSI->_depth; local_3d8 = local_3d8 + 1) {
          for (local_3dc = 0; (int)local_3dc < (int)in_RSI->_height; local_3dc = local_3dc + 1) {
            for (local_3e0 = 0; (int)local_3e0 < (int)in_RSI->_width; local_3e0 = local_3e0 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_3d4,local_3dc,local_3e0,local_3d8,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(local_20,"cyzx",4);
    if (iVar6 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_3f4 = 0; (int)local_3f4 < (int)in_RSI->_spectrum; local_3f4 = local_3f4 + 1) {
        for (local_3f8 = 0; (int)local_3f8 < (int)in_RSI->_depth; local_3f8 = local_3f8 + 1) {
          for (local_3fc = 0; (int)local_3fc < (int)in_RSI->_height; local_3fc = local_3fc + 1) {
            for (local_400 = 0; (int)local_400 < (int)in_RSI->_width; local_400 = local_400 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_3f4,local_3fc,local_3f8,local_400,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(local_20,"czxy",4);
    if (iVar6 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      uVar7 = (ulong)local_48._width;
      uVar11 = (ulong)local_48._height;
      uVar12 = (ulong)local_48._depth;
      for (local_414 = 0; (int)local_414 < (int)in_RSI->_spectrum; local_414 = local_414 + 1) {
        for (local_418 = 0; (int)local_418 < (int)in_RSI->_depth; local_418 = local_418 + 1) {
          for (local_41c = 0; (int)local_41c < (int)in_RSI->_height; local_41c = local_41c + 1) {
            for (local_420 = 0; (int)local_420 < (int)in_RSI->_width; local_420 = local_420 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_414,local_418,local_420,local_41c,uVar7 * uVar11,
                                  uVar7 * uVar11 * uVar12);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(local_20,"czyx",4);
    if (iVar6 == 0) {
      assign(in_stack_fffffffffffffa60,(uint)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             (uint)in_stack_fffffffffffffa58,(uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
             (uint)in_stack_fffffffffffffa50);
      for (local_434 = 0; (int)local_434 < (int)in_RSI->_spectrum; local_434 = local_434 + 1) {
        for (local_438 = 0; (int)local_438 < (int)in_RSI->_depth; local_438 = local_438 + 1) {
          for (local_43c = 0; (int)local_43c < (int)in_RSI->_height; local_43c = local_43c + 1) {
            for (local_440 = 0; (int)local_440 < (int)in_RSI->_width; local_440 = local_440 + 1) {
              uVar13 = *local_50;
              puVar8 = operator()(&local_48,local_434,local_438,local_43c,local_440,
                                  (ulong)local_48._width * (ulong)local_48._height,
                                  (ulong)local_48._width * (ulong)local_48._height *
                                  (ulong)local_48._depth);
              *puVar8 = uVar13;
              local_50 = local_50 + 1;
            }
          }
        }
      }
    }
    puVar8 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)&local_48);
    if (puVar8 == (uint *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      uVar13 = in_RSI->_width;
      uVar1 = in_RSI->_height;
      uVar2 = in_RSI->_depth;
      uVar3 = in_RSI->_spectrum;
      puVar8 = in_RSI->_data;
      pcVar9 = "non-";
      if ((in_RSI->_is_shared & 1U) != 0) {
        pcVar9 = "";
      }
      pcVar10 = pixel_type();
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes() : Invalid specified permutation \'%s\'."
                 ,(ulong)uVar13,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,puVar8,pcVar9,pcVar10,
                 local_20);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                  CImgArgumentException::~CImgArgumentException);
    }
    CImg(in_stack_fffffffffffffa18,(CImg<unsigned_int> *)CONCAT44(in_stack_fffffffffffffa14,iVar5));
  }
LAB_0016d13c:
  ~CImg(in_stack_fffffffffffff980);
  return in_RDI;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return (+*this);
      if (!cimg::strncasecmp(permut,"xycz",4)) {
        res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
        res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
        res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
        res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
        res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
        res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
        res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
        res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
        res.assign(_height,_depth,_spectrum,_width);
        switch (_width) {
        case 1 : {
          t *ptr_r = res.data(0,0,0,0);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++);
          }
        } break;
        case 2 : {
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
        }
        }
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
        res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
        res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
        res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
        res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
        res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
        res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
        res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
        res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
        res.assign(_spectrum,_width,_height,_depth);
        switch (_spectrum) {
        case 1 : {
          const T *ptr_r = data(0,0,0,0);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++);
          }
        } break;
        case 2 : {
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
        }
        }
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
        res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
        res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
        res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
        res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
        res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes() : Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }